

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O2

cmDependInformation * __thiscall
anon_unknown.dwarf_6ab57f::cmLBDepend::GetDependInformation
          (cmLBDepend *this,string *file,string *extraPath)

{
  cmDependInformation *__rhs;
  DirectoryToFileToPathMapType *this_00;
  _Rb_tree_header *__x;
  size_t *psVar1;
  pointer pbVar2;
  _Base_ptr p_Var3;
  default_delete<(anonymous_namespace)::cmDependInformation> *this_01;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  _Rb_tree_header *p_Var8;
  bool bVar9;
  iterator iVar10;
  iterator iVar11;
  mapped_type *pmVar12;
  mapped_type *pmVar13;
  iterator iVar14;
  _Head_base<0UL,_(anonymous_namespace)::cmDependInformation_*,_false> __s;
  cmDependInformation *this_02;
  ulong uVar15;
  _Rb_tree_node_base *p_Var16;
  _Head_base<0UL,_(anonymous_namespace)::cmDependInformation_*,_false> _Var17;
  _Alloc_hider in_RCX;
  pointer pbVar18;
  _Base_ptr *__rhs_00;
  cmDependInformation *__ptr;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar19;
  string fullPath;
  string path;
  __single_object info;
  
  this_00 = &this->DirectoryToFileToPathMap;
  iVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
           ::find(&this_00->_M_t,extraPath);
  if (((_Rb_tree_header *)iVar10._M_node ==
       &(this->DirectoryToFileToPathMap)._M_t._M_impl.super__Rb_tree_header) ||
     (iVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(iVar10._M_node + 2,file),
     iVar11._M_node == (_Base_ptr)&iVar10._M_node[2]._M_parent)) {
    bVar9 = cmsys::SystemTools::FileExists(file,true);
    if (!bVar9) {
      pbVar2 = (this->IncludeDirectories).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar18 = (this->IncludeDirectories).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar18 != pbVar2;
          pbVar18 = pbVar18 + 1) {
        std::__cxx11::string::string((string *)&path,(string *)pbVar18);
        if ((path._M_string_length != 0) &&
           (in_RCX = path._M_dataplus, path._M_dataplus._M_p[path._M_string_length - 1] != '/')) {
          std::__cxx11::string::append((char *)&path);
        }
        std::__cxx11::string::append((string *)&path);
        bVar9 = cmsys::SystemTools::FileExists(&path,true);
        if (bVar9) {
          cmsys::SystemTools::CollapseFullPath(&fullPath,&path);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    ::operator[](this_00,extraPath);
          pmVar13 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](pmVar12,file);
          std::__cxx11::string::_M_assign((string *)pmVar13);
          goto LAB_0023c758;
        }
        std::__cxx11::string::~string((string *)&path);
      }
      if (extraPath->_M_string_length != 0) {
        std::__cxx11::string::string((string *)&path,(string *)extraPath);
        if ((path._M_string_length != 0) &&
           (in_RCX = path._M_dataplus, path._M_dataplus._M_p[path._M_string_length - 1] != '/')) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
                         &path,"/");
          std::__cxx11::string::operator=((string *)&path,(string *)&info);
          std::__cxx11::string::~string((string *)&info);
          in_RCX._M_p = path._M_dataplus._M_p;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
                       &path,file);
        std::__cxx11::string::operator=((string *)&path,(string *)&info);
        std::__cxx11::string::~string((string *)&info);
        bVar9 = cmsys::SystemTools::FileExists(&path,true);
        if (bVar9) {
          cmsys::SystemTools::CollapseFullPath(&fullPath,&path);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    ::operator[](this_00,extraPath);
          pmVar13 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](pmVar12,file);
          std::__cxx11::string::_M_assign((string *)pmVar13);
LAB_0023c758:
          std::__cxx11::string::~string((string *)&path);
          goto LAB_0023c77b;
        }
        std::__cxx11::string::~string((string *)&path);
      }
      goto LAB_0023c776;
    }
    cmsys::SystemTools::CollapseFullPath(&fullPath,file);
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
              ::operator[](this_00,extraPath);
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](pmVar12,file);
    std::__cxx11::string::_M_assign((string *)pmVar13);
  }
  else {
    file = (string *)(iVar11._M_node + 2);
LAB_0023c776:
    std::__cxx11::string::string((string *)&fullPath,(string *)file);
  }
LAB_0023c77b:
  __x = &(this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header;
  iVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
           ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                             *)(this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header.
                               _M_header._M_parent,(_Link_type)__x,(_Base_ptr)&fullPath,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RCX._M_p);
  if (((_Rb_tree_header *)iVar14._M_node != __x) &&
     (bVar9 = std::operator<(&fullPath,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (iVar14._M_node + 1)), !bVar9)) {
    __s._M_head_impl = *(cmDependInformation **)(iVar14._M_node + 2);
    goto LAB_0023ca74;
  }
  __s._M_head_impl = (cmDependInformation *)operator_new(0xa0);
  p_Var8 = &((__s._M_head_impl)->DependencySet)._M_t._M_impl.super__Rb_tree_header;
  memset(__s._M_head_impl,0,0xa0);
  *(_Rb_tree_header **)
   ((long)&((__s._M_head_impl)->DependencySet)._M_t._M_impl.super__Rb_tree_header + 0x10) = p_Var8;
  *(_Rb_tree_header **)
   ((long)&((__s._M_head_impl)->DependencySet)._M_t._M_impl.super__Rb_tree_header + 0x18) = p_Var8;
  ((__s._M_head_impl)->FullPath)._M_dataplus._M_p = (pointer)&((__s._M_head_impl)->FullPath).field_2
  ;
  ((__s._M_head_impl)->PathOnly)._M_dataplus._M_p = (pointer)&((__s._M_head_impl)->PathOnly).field_2
  ;
  ((__s._M_head_impl)->IncludeName)._M_dataplus._M_p =
       (pointer)&((__s._M_head_impl)->IncludeName).field_2;
  info._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::cmDependInformation_*,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
  .super__Head_base<0UL,_(anonymous_namespace)::cmDependInformation_*,_false>._M_head_impl =
       (__uniq_ptr_data<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>,_true,_true>
        )(__uniq_ptr_data<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>,_true,_true>
          )__s._M_head_impl;
  std::__cxx11::string::_M_assign((string *)&(__s._M_head_impl)->FullPath);
  cmsys::SystemTools::GetFilenamePath(&path,&fullPath);
  std::__cxx11::string::operator=((string *)&(__s._M_head_impl)->PathOnly,(string *)&path);
  std::__cxx11::string::~string((string *)&path);
  std::__cxx11::string::_M_assign((string *)&(__s._M_head_impl)->IncludeName);
  iVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
           ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                             *)(this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header.
                               _M_header._M_parent,(_Link_type)__x,(_Base_ptr)&fullPath,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RCX._M_p);
  _Var17._M_head_impl = __s._M_head_impl;
  if ((_Rb_tree_header *)iVar14._M_node == __x) {
LAB_0023c87e:
    this_02 = (cmDependInformation *)operator_new(0x48);
    __rhs_00 = &(this_02->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    std::__cxx11::string::string((string *)__rhs_00,(string *)&fullPath);
    (this_02->FullPath)._M_dataplus._M_p = (pointer)0x0;
    if ((_Rb_tree_header *)iVar14._M_node == __x) {
      if (((this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
         (__ptr = (cmDependInformation *)__rhs_00,
         bVar9 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_right + 1),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__rhs_00), !bVar9)) {
LAB_0023c9d5:
        __ptr = (cmDependInformation *)__rhs_00;
        pVar19 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                 ::_M_get_insert_unique_pos(&(this->DependInformationMap)._M_t,(key_type *)__rhs_00)
        ;
      }
      else {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = (this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_right;
        pVar19 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar5 << 0x40);
      }
LAB_0023c9fb:
      iVar14._M_node = pVar19.first;
      if (pVar19.second == (_Rb_tree_node_base *)0x0) {
LAB_0023ca44:
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
        ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                        *)this_02,(_Link_type)__ptr);
        goto LAB_0023ca52;
      }
    }
    else {
      __rhs = (cmDependInformation *)(iVar14._M_node + 1);
      __ptr = __rhs;
      bVar9 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __rhs_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__rhs);
      if (!bVar9) {
        __ptr = (cmDependInformation *)__rhs_00;
        bVar9 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __rhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)__rhs_00);
        if (bVar9) {
          p_Var3 = (this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_right;
          if (p_Var3 == iVar14._M_node) {
            auVar6._8_8_ = 0;
            auVar6._0_8_ = p_Var3;
            pVar19 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar6 << 0x40);
          }
          else {
            p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(iVar14._M_node);
            __ptr = (cmDependInformation *)(p_Var16 + 1);
            bVar9 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__rhs_00,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__ptr);
            if (bVar9) {
              pVar19.second = p_Var16;
              pVar19.first = p_Var16;
              if ((iVar14._M_node)->_M_right == (_Base_ptr)0x0) {
                auVar7._8_8_ = 0;
                auVar7._0_8_ = iVar14._M_node;
                pVar19 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)
                         (auVar7 << 0x40);
                goto LAB_0023ca06;
              }
            }
            else {
              __ptr = (cmDependInformation *)__rhs_00;
              pVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                       ::_M_get_insert_unique_pos
                                 (&(this->DependInformationMap)._M_t,(key_type *)__rhs_00);
            }
          }
          goto LAB_0023c9fb;
        }
        goto LAB_0023ca44;
      }
      p_Var3 = (this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pVar19.second = p_Var3;
      pVar19.first = p_Var3;
      if (p_Var3 == iVar14._M_node) goto LAB_0023c9fb;
      uVar15 = std::_Rb_tree_decrement(iVar14._M_node);
      __ptr = (cmDependInformation *)__rhs_00;
      bVar9 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (uVar15 + 0x20),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __rhs_00);
      if (!bVar9) goto LAB_0023c9d5;
      pVar19.second = iVar14._M_node;
      pVar19.first = iVar14._M_node;
      if (*(long *)(uVar15 + 0x18) != 0) goto LAB_0023c9fb;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar15;
      pVar19 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar4 << 0x40);
    }
LAB_0023ca06:
    p_Var16 = pVar19.second;
    bVar9 = true;
    if ((__x != (_Rb_tree_header *)p_Var16) && (pVar19.first == (_Rb_tree_node_base *)0x0)) {
      bVar9 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __rhs_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(p_Var16 + 1));
    }
    __ptr = this_02;
    std::_Rb_tree_insert_and_rebalance(bVar9,(_Rb_tree_node_base *)this_02,p_Var16,&__x->_M_header);
    psVar1 = &(this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar1 = *psVar1 + 1;
    _Var17._M_head_impl = (cmDependInformation *)info;
    iVar14._M_node = (_Base_ptr)this_02;
  }
  else {
    __ptr = (cmDependInformation *)(iVar14._M_node + 1);
    bVar9 = std::operator<(&fullPath,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __ptr);
    if (bVar9) goto LAB_0023c87e;
  }
LAB_0023ca52:
  info._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::cmDependInformation_*,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
  .super__Head_base<0UL,_(anonymous_namespace)::cmDependInformation_*,_false>._M_head_impl =
       (__uniq_ptr_data<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>,_true,_true>
        )(__uniq_ptr_impl<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
          )0x0;
  this_01 = (default_delete<(anonymous_namespace)::cmDependInformation> *)
            (((cmDependInformation *)iVar14._M_node)->FullPath)._M_dataplus._M_p;
  (((cmDependInformation *)iVar14._M_node)->FullPath)._M_dataplus._M_p =
       (pointer)_Var17._M_head_impl;
  if (this_01 != (default_delete<(anonymous_namespace)::cmDependInformation> *)0x0) {
    std::default_delete<(anonymous_namespace)::cmDependInformation>::operator()(this_01,__ptr);
  }
  std::
  unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
  ::~unique_ptr(&info);
LAB_0023ca74:
  std::__cxx11::string::~string((string *)&fullPath);
  return (cmDependInformation *)
         (_Tuple_impl<0UL,_(anonymous_namespace)::cmDependInformation_*,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
          )__s._M_head_impl;
}

Assistant:

cmDependInformation* GetDependInformation(const std::string& file,
                                            const std::string& extraPath)
  {
    // Get the full path for the file so that lookup is unambiguous.
    std::string fullPath = this->FullPath(file, extraPath);

    // Try to find the file's instance of cmDependInformation.
    auto result = this->DependInformationMap.find(fullPath);
    if (result != this->DependInformationMap.end()) {
      // Found an instance, return it.
      return result->second.get();
    }
    // Didn't find an instance.  Create a new one and save it.
    auto info = cm::make_unique<cmDependInformation>();
    auto* ptr = info.get();
    info->FullPath = fullPath;
    info->PathOnly = cmSystemTools::GetFilenamePath(fullPath);
    info->IncludeName = file;
    this->DependInformationMap[fullPath] = std::move(info);
    return ptr;
  }